

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O3

exr_result_t
internal_exr_compute_tile_information(exr_context_t ctxt,exr_priv_part_t curpart,int rebuild)

{
  int32_t *piVar1;
  int32_t *piVar2;
  byte bVar3;
  exr_attr_tiledesc_t *peVar4;
  bool bVar5;
  exr_result_t eVar6;
  long lVar7;
  ulong uVar8;
  int32_t *piVar9;
  long lVar10;
  _func_exr_result_t_exr_const_context_t_exr_result_t *UNRECOVERED_JUMPTABLE;
  int iVar11;
  undefined4 uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  char *pcVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  uint uVar21;
  long lVar22;
  uint uVar23;
  int iVar24;
  int64_t dsize_1;
  int64_t dsize;
  
  if ((curpart->storage_mode < (EXR_STORAGE_LAST_TYPE|EXR_STORAGE_DEEP_SCANLINE)) &&
     ((0x25U >> (curpart->storage_mode & 0x1f) & 1) != 0)) {
    return 0;
  }
  if ((ctxt->mode == '\x04') && (curpart->tiles == (exr_attribute_t *)0x0)) {
    return 0;
  }
  if (rebuild == 0) {
    if (curpart->tiles == (exr_attribute_t *)0x0) {
      UNRECOVERED_JUMPTABLE = ctxt->standard_error;
      eVar6 = 0xd;
      goto LAB_00125472;
    }
    if (curpart->tile_level_tile_count_x != (int32_t *)0x0) {
      return 0;
    }
  }
  else {
    if (curpart->dataWindow == (exr_attribute_t *)0x0) {
      return 0;
    }
    if (curpart->tiles == (exr_attribute_t *)0x0) {
      return 0;
    }
    if (curpart->tile_level_tile_count_x != (int32_t *)0x0) {
      (*ctxt->free_fn)(curpart->tile_level_tile_count_x);
      curpart->tile_level_tile_count_x = (int32_t *)0x0;
    }
  }
  peVar4 = (curpart->tiles->field_6).tiledesc;
  if ((peVar4->x_size == 0) || (peVar4->y_size == 0)) {
LAB_001251b9:
    UNRECOVERED_JUMPTABLE = ctxt->standard_error;
    eVar6 = 0xe;
  }
  else {
    lVar18 = (long)(curpart->data_window).min.x;
    lVar15 = (long)(curpart->data_window).min.y;
    lVar19 = (long)(curpart->data_window).max.x;
    lVar17 = (long)(curpart->data_window).max.y;
    lVar22 = lVar19 - lVar18;
    uVar14 = lVar22 + 1;
    lVar7 = lVar17 - lVar15;
    uVar8 = lVar7 + 1;
    bVar3 = peVar4->level_and_round;
    uVar23 = 1;
    if ((bVar3 & 0xf) == 0) {
      uVar21 = 1;
    }
    else if ((bVar3 & 0xf) == 2) {
      uVar23 = 1;
      uVar21 = 1;
      if (bVar3 < 0x10) {
        if (0 < lVar22) {
          uVar23 = 1;
          uVar13 = uVar14;
          do {
            uVar23 = uVar23 + 1;
            bVar5 = 3 < uVar13;
            uVar13 = uVar13 >> 1;
          } while (bVar5);
        }
        if (0 < lVar7) {
          uVar21 = 1;
          uVar13 = uVar8;
          do {
            uVar21 = uVar21 + 1;
            bVar5 = 3 < uVar13;
            uVar13 = uVar13 >> 1;
          } while (bVar5);
        }
      }
      else {
        if (0 < lVar22) {
          iVar24 = 0;
          iVar11 = 1;
          uVar13 = uVar14;
          do {
            if ((uVar13 & 1) != 0) {
              iVar24 = 1;
            }
            iVar11 = iVar11 + 1;
            bVar5 = 3 < uVar13;
            uVar13 = uVar13 >> 1;
          } while (bVar5);
          uVar23 = iVar24 + iVar11;
        }
        if (0 < lVar7) {
          iVar24 = 0;
          iVar11 = 1;
          uVar13 = uVar8;
          do {
            if ((uVar13 & 1) != 0) {
              iVar24 = 1;
            }
            iVar11 = iVar11 + 1;
            bVar5 = 3 < uVar13;
            uVar13 = uVar13 >> 1;
          } while (bVar5);
          uVar21 = iVar24 + iVar11;
        }
      }
    }
    else {
      if ((bVar3 & 0xf) != 1) goto LAB_001251b9;
      uVar13 = uVar8;
      if ((long)uVar8 < (long)uVar14) {
        uVar13 = uVar14;
      }
      uVar21 = 1;
      if (bVar3 < 0x10) {
        if (1 < (long)uVar13) {
          uVar23 = 1;
          do {
            uVar23 = uVar23 + 1;
            bVar5 = 3 < uVar13;
            uVar13 = uVar13 >> 1;
            uVar21 = uVar23;
          } while (bVar5);
        }
      }
      else if (1 < (long)uVar13) {
        iVar24 = 0;
        iVar11 = 1;
        do {
          if ((uVar13 & 1) != 0) {
            iVar24 = 1;
          }
          iVar11 = iVar11 + 1;
          bVar5 = 3 < uVar13;
          uVar13 = uVar13 >> 1;
        } while (bVar5);
        uVar23 = iVar24 + iVar11;
        uVar21 = uVar23;
      }
    }
    curpart->num_tile_levels_x = uVar23;
    curpart->num_tile_levels_y = uVar21;
    piVar9 = (int32_t *)(*ctxt->alloc_fn)((long)(int)(uVar21 + uVar23) << 3);
    if (piVar9 != (int32_t *)0x0) {
      piVar1 = piVar9 + (int)uVar23;
      if (0 < (int)uVar23) {
        bVar3 = peVar4->level_and_round;
        uVar13 = 0;
        do {
          lVar10 = (long)uVar14 / (1L << ((byte)uVar13 & 0x3f));
          lVar10 = (ulong)(lVar10 << ((byte)uVar13 & 0x3f) <= lVar22 && (bVar3 & 0xf0) == 0x10) +
                   lVar10;
          lVar20 = lVar10;
          if (lVar10 < 2) {
            lVar20 = 1;
          }
          if (0x7fffffff < lVar10) {
            uVar12 = (undefined4)uVar13;
            pcVar16 = 
            "Invalid data window x dims (%d, %d) resulting in invalid tile level size (%ld) for level %d"
            ;
            goto LAB_001254bc;
          }
          piVar9[uVar13] = (int32_t)(((lVar20 + (ulong)peVar4->x_size) - 1) / (ulong)peVar4->x_size)
          ;
          piVar1[uVar13] = (int32_t)lVar20;
          uVar13 = uVar13 + 1;
        } while (uVar23 != uVar13);
      }
      piVar2 = piVar1 + (int)uVar23;
      if (0 < (int)uVar21) {
        bVar3 = peVar4->level_and_round;
        uVar14 = 0;
        do {
          lVar18 = (long)uVar8 / (1L << ((byte)uVar14 & 0x3f));
          lVar18 = (ulong)(lVar18 << ((byte)uVar14 & 0x3f) <= lVar7 && (bVar3 & 0xf0) == 0x10) +
                   lVar18;
          lVar20 = lVar18;
          if (lVar18 < 2) {
            lVar20 = 1;
          }
          if (0x7fffffff < lVar18) {
            uVar12 = (undefined4)uVar14;
            pcVar16 = 
            "Invalid data window y dims (%d, %d) resulting in invalid tile level size (%ld) for level %d"
            ;
            lVar18 = lVar15;
            lVar19 = lVar17;
LAB_001254bc:
            eVar6 = (*ctxt->print_error)(ctxt,0xe,pcVar16,lVar18,lVar19,lVar20,uVar12);
            return eVar6;
          }
          piVar2[uVar14] = (int32_t)(((lVar20 + (ulong)peVar4->y_size) - 1) / (ulong)peVar4->y_size)
          ;
          (piVar2 + (int)uVar21)[uVar14] = (int32_t)lVar20;
          uVar14 = uVar14 + 1;
        } while (uVar21 != uVar14);
      }
      curpart->tile_level_tile_count_x = piVar9;
      curpart->tile_level_tile_count_y = piVar2;
      curpart->tile_level_tile_size_x = piVar1;
      curpart->tile_level_tile_size_y = piVar2 + (int)uVar21;
      return 0;
    }
    UNRECOVERED_JUMPTABLE = ctxt->standard_error;
    eVar6 = 1;
  }
LAB_00125472:
  eVar6 = (*UNRECOVERED_JUMPTABLE)(ctxt,eVar6);
  return eVar6;
}

Assistant:

exr_result_t
internal_exr_compute_tile_information (
    exr_context_t ctxt, exr_priv_part_t curpart, int rebuild)
{
    exr_result_t rv = EXR_ERR_SUCCESS;
    if (curpart->storage_mode == EXR_STORAGE_SCANLINE ||
        curpart->storage_mode == EXR_STORAGE_DEEP_SCANLINE ||
        curpart->storage_mode == EXR_STORAGE_UNKNOWN)
        return EXR_ERR_SUCCESS;

    if (ctxt->mode == EXR_CONTEXT_TEMPORARY && !curpart->tiles)
        return EXR_ERR_SUCCESS;

    if (rebuild && (!curpart->dataWindow || !curpart->tiles))
        return EXR_ERR_SUCCESS;

    if (!curpart->tiles)
        return ctxt->standard_error (ctxt, EXR_ERR_MISSING_REQ_ATTR);

    if (rebuild)
    {
        if (curpart->tile_level_tile_count_x)
        {
            ctxt->free_fn (curpart->tile_level_tile_count_x);
            curpart->tile_level_tile_count_x = NULL;
        }
    }

    if (curpart->tile_level_tile_count_x == NULL)
    {
        const exr_attr_box2i_t     dw       = curpart->data_window;
        const exr_attr_tiledesc_t* tiledesc = curpart->tiles->tiledesc;
        int64_t                    w, h;
        int32_t                    numX, numY;
        int32_t*                   levcntX = NULL;
        int32_t*                   levcntY = NULL;
        int32_t*                   levszX  = NULL;
        int32_t*                   levszY  = NULL;

        w = ((int64_t) dw.max.x) - ((int64_t) dw.min.x) + 1;
        h = ((int64_t) dw.max.y) - ((int64_t) dw.min.y) + 1;

        if (tiledesc->x_size == 0 || tiledesc->y_size == 0)
            return ctxt->standard_error (ctxt, EXR_ERR_INVALID_ATTR);
        switch (EXR_GET_TILE_LEVEL_MODE ((*tiledesc)))
        {
            case EXR_TILE_ONE_LEVEL: numX = numY = 1; break;
            case EXR_TILE_MIPMAP_LEVELS:
                if (EXR_GET_TILE_ROUND_MODE ((*tiledesc)) ==
                    EXR_TILE_ROUND_DOWN)
                {
                    numX = floor_log2 (w > h ? w : h) + 1;
                    numY = numX;
                }
                else
                {
                    numX = ceil_log2 (w > h ? w : h) + 1;
                    numY = numX;
                }
                break;
            case EXR_TILE_RIPMAP_LEVELS:
                if (EXR_GET_TILE_ROUND_MODE ((*tiledesc)) ==
                    EXR_TILE_ROUND_DOWN)
                {
                    numX = floor_log2 (w) + 1;
                    numY = floor_log2 (h) + 1;
                }
                else
                {
                    numX = ceil_log2 (w) + 1;
                    numY = ceil_log2 (h) + 1;
                }
                break;
            case EXR_TILE_LAST_TYPE:
            default: return ctxt->standard_error (ctxt, EXR_ERR_INVALID_ATTR);
        }

        curpart->num_tile_levels_x = numX;
        curpart->num_tile_levels_y = numY;
        levcntX                    = (int32_t*) ctxt->alloc_fn (
            2 * (size_t) (numX + numY) * sizeof (int32_t));
        if (levcntX == NULL)
            return ctxt->standard_error (ctxt, EXR_ERR_OUT_OF_MEMORY);
        levszX  = levcntX + numX;
        levcntY = levszX + numX;
        levszY  = levcntY + numY;

        for (int32_t l = 0; l < numX; ++l)
        {
            int64_t sx = calc_level_size (
                dw.min.x, dw.max.x, l, EXR_GET_TILE_ROUND_MODE ((*tiledesc)));
            if (sx < 0 || sx > (int64_t) INT32_MAX)
                return ctxt->print_error (
                    ctxt,
                    EXR_ERR_INVALID_ATTR,
                    "Invalid data window x dims (%d, %d) resulting in invalid tile level size (%" PRId64
                    ") for level %d",
                    dw.min.x,
                    dw.max.x,
                    sx,
                    l);
            levcntX[l] = (int32_t) (((uint64_t) sx + tiledesc->x_size - 1) /
                                    tiledesc->x_size);
            levszX[l]  = (int32_t) sx;
        }

        for (int32_t l = 0; l < numY; ++l)
        {
            int64_t sy = calc_level_size (
                dw.min.y, dw.max.y, l, EXR_GET_TILE_ROUND_MODE ((*tiledesc)));
            if (sy < 0 || sy > (int64_t) INT32_MAX)
                return ctxt->print_error (
                    ctxt,
                    EXR_ERR_INVALID_ATTR,
                    "Invalid data window y dims (%d, %d) resulting in invalid tile level size (%" PRId64
                    ") for level %d",
                    dw.min.y,
                    dw.max.y,
                    sy,
                    l);
            levcntY[l] = (int32_t) (((uint64_t) sy + tiledesc->y_size - 1) /
                                    tiledesc->y_size);
            levszY[l]  = (int32_t) sy;
        }

        curpart->tile_level_tile_count_x = levcntX;
        curpart->tile_level_tile_count_y = levcntY;
        curpart->tile_level_tile_size_x  = levszX;
        curpart->tile_level_tile_size_y  = levszY;
    }
    return rv;
}